

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

uint32_t __thiscall
RoboClaw::Read4_1(RoboClaw *this,uint8_t address,uint8_t cmd,uint8_t *status,bool *valid)

{
  uint8_t data_00;
  ushort uVar1;
  ushort uVar2;
  uint16_t uVar3;
  ssize_t sVar4;
  uint8_t *in_RCX;
  undefined7 uVar6;
  size_t __nbytes;
  uint8_t *puVar5;
  byte in_DL;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 uVar7;
  undefined1 extraout_DL_05;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  byte in_SIL;
  RoboClaw *in_RDI;
  undefined1 *in_R8;
  bool bVar8;
  uint16_t ccrc;
  int16_t data;
  uint8_t trys;
  uint32_t value;
  uint8_t crc;
  ushort local_34;
  char local_31;
  uint local_30;
  
  if (in_R8 != (undefined1 *)0x0) {
    *in_R8 = 0;
  }
  local_31 = '\x02';
  puVar5 = in_RCX;
  do {
    (*in_RDI->_vptr_RoboClaw[1])();
    crc_clear(in_RDI);
    uVar6 = (undefined7)((ulong)puVar5 >> 8);
    (**in_RDI->_vptr_RoboClaw)(in_RDI,(ulong)in_SIL);
    crc_update(in_RDI,in_SIL);
    __nbytes = CONCAT71(uVar6,in_DL);
    (**in_RDI->_vptr_RoboClaw)(in_RDI,(ulong)in_DL);
    crc_update(in_RDI,in_DL);
    sVar4 = read(in_RDI,in_RDI->m_timeout,(void *)CONCAT71(extraout_var,extraout_DL),__nbytes);
    local_34 = (ushort)sVar4 & 0xff;
    crc_update(in_RDI,(uint8_t)sVar4);
    local_30 = (int)(short)local_34 << 0x18;
    uVar7 = extraout_DL_00;
    uVar6 = extraout_var_00;
    if (local_34 != 0xffff) {
      sVar4 = read(in_RDI,in_RDI->m_timeout,(void *)CONCAT71(extraout_var_00,extraout_DL_00),
                   __nbytes);
      local_34 = (ushort)sVar4 & 0xff;
      crc_update(in_RDI,(uint8_t)sVar4);
      local_30 = (int)(short)local_34 << 0x10 | local_30;
      uVar7 = extraout_DL_01;
      uVar6 = extraout_var_01;
    }
    if (local_34 != 0xffff) {
      sVar4 = read(in_RDI,in_RDI->m_timeout,(void *)CONCAT71(uVar6,uVar7),__nbytes);
      local_34 = (ushort)sVar4 & 0xff;
      crc_update(in_RDI,(uint8_t)sVar4);
      local_30 = (int)(short)local_34 << 8 | local_30;
      uVar7 = extraout_DL_02;
      uVar6 = extraout_var_02;
    }
    if (local_34 != 0xffff) {
      sVar4 = read(in_RDI,in_RDI->m_timeout,(void *)CONCAT71(uVar6,uVar7),__nbytes);
      local_34 = (ushort)sVar4 & 0xff;
      crc_update(in_RDI,(uint8_t)sVar4);
      local_30 = (int)(short)local_34 | local_30;
      uVar7 = extraout_DL_03;
      uVar6 = extraout_var_03;
    }
    if (local_34 != 0xffff) {
      sVar4 = read(in_RDI,in_RDI->m_timeout,(void *)CONCAT71(uVar6,uVar7),__nbytes);
      local_34 = (ushort)sVar4 & 0xff;
      data_00 = (uint8_t)sVar4;
      crc_update(in_RDI,data_00);
      uVar7 = extraout_DL_04;
      uVar6 = extraout_var_04;
      if (in_RCX != (uint8_t *)0x0) {
        __nbytes = CONCAT71((int7)(__nbytes >> 8),data_00);
        *in_RCX = data_00;
      }
    }
    if (local_34 != 0xffff) {
      sVar4 = read(in_RDI,in_RDI->m_timeout,(void *)CONCAT71(uVar6,uVar7),__nbytes);
      uVar1 = (ushort)sVar4 & 0xff;
      if (uVar1 != 0xffff) {
        sVar4 = read(in_RDI,in_RDI->m_timeout,(void *)CONCAT71(extraout_var_05,extraout_DL_05),
                     __nbytes);
        uVar2 = (ushort)sVar4 & 0xff;
        if (uVar2 != 0xffff) {
          uVar2 = uVar1 << 8 | uVar2;
          uVar3 = crc_get(in_RDI);
          __nbytes = (size_t)uVar2;
          if (uVar3 == uVar2) {
            *in_R8 = 1;
            return local_30;
          }
        }
      }
    }
    puVar5 = (uint8_t *)CONCAT71((int7)(__nbytes >> 8),local_31 + -1);
    bVar8 = local_31 != '\0';
    local_31 = local_31 + -1;
  } while (bVar8);
  return 0;
}

Assistant:

uint32_t RoboClaw::Read4_1( uint8_t address, uint8_t cmd, uint8_t *status, bool *valid)
{
    uint8_t crc;

    if(valid)
        *valid = false;

    uint32_t value=0;
    uint8_t trys=MAXRETRY;
    int16_t data;
    do{
        flush();

        crc_clear();
        write( address );
        crc_update( address );
        write(cmd);
        crc_update(cmd);

        data = read( m_timeout );
        crc_update(data);
        value=(uint32_t)data<<24;

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            value|=(uint32_t)data<<16;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            value|=(uint32_t)data<<8;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            value|=(uint32_t)data;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            if(status)
                *status = data;
        }

        if( data != -1 )
        {
            uint16_t ccrc;
            data = read( m_timeout );
            if( data != -1 )
            {
                ccrc = data << 8;
                data = read( m_timeout );
                if( data != -1 )
                {
                    ccrc |= data;
                    if(crc_get()==ccrc)
                    {
                        *valid = true;
                        return value;
                    }
                }
            }
        }
    }while(trys--);

    return false;
}